

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O1

double Gudhi::Persistence_representations::compute_max_norm_distance_of_landscapes
                 (Persistence_landscape_on_grid *first,Persistence_landscape_on_grid *second)

{
  pointer pvVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  size_t j_1;
  ulong uVar10;
  size_t j;
  ulong uVar11;
  double dVar12;
  double dVar13;
  
  pvVar1 = (first->values_of_landscapes).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (second->values_of_landscapes).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(first->values_of_landscapes).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 ==
      (long)(second->values_of_landscapes).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2) {
    if ((first->grid_min == second->grid_min) && (!NAN(first->grid_min) && !NAN(second->grid_min)))
    {
      if ((first->grid_max == second->grid_max) && (!NAN(first->grid_max) && !NAN(second->grid_max))
         ) {
        lVar7 = (long)(first->values_of_landscapes).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
        if (lVar7 == 0) {
          dVar12 = 0.0;
        }
        else {
          dVar12 = 0.0;
          lVar8 = 0;
          do {
            lVar3 = *(long *)&pvVar1[lVar8].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data;
            uVar9 = (long)*(pointer *)
                           ((long)&pvVar1[lVar8].super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data + 8) - lVar3 >> 3;
            lVar4 = *(long *)&pvVar2[lVar8].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data;
            uVar10 = (long)*(pointer *)
                            ((long)&pvVar2[lVar8].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + 8) - lVar4 >> 3;
            uVar11 = uVar9;
            if (uVar10 < uVar9) {
              uVar11 = uVar10;
            }
            if (uVar11 != 0) {
              uVar6 = 0;
              do {
                dVar13 = ABS(*(double *)(lVar3 + uVar6 * 8) - *(double *)(lVar4 + uVar6 * 8));
                if (dVar13 <= dVar12) {
                  dVar13 = dVar12;
                }
                dVar12 = dVar13;
                uVar6 = uVar6 + 1;
              } while (uVar11 != uVar6);
            }
            uVar11 = uVar9;
            dVar13 = dVar12;
            if (uVar9 < uVar10) {
              do {
                dVar12 = *(double *)(lVar4 + uVar11 * 8);
                if (dVar12 <= dVar13) {
                  dVar12 = dVar13;
                }
                uVar11 = uVar11 + 1;
                dVar13 = dVar12;
              } while (uVar10 != uVar11);
            }
            dVar13 = dVar12;
            if (uVar10 < uVar9) {
              do {
                dVar12 = *(double *)(lVar3 + uVar10 * 8);
                if (dVar12 <= dVar13) {
                  dVar12 = dVar13;
                }
                uVar10 = uVar10 + 1;
                dVar13 = dVar12;
              } while (uVar9 != uVar10);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != (lVar7 >> 3) * -0x5555555555555555);
        }
        return dVar12;
      }
    }
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Two grids are not compatible";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

void set_up_numbers_of_functions_for_vectorization_and_projections_to_reals() {
    // warning, this function can be only called after filling in the values_of_landscapes vector.
    this->number_of_functions_for_vectorization = this->values_of_landscapes.size();
    this->number_of_functions_for_projections_to_reals = this->values_of_landscapes.size();
  }